

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall QToolBarAreaLayoutInfo::fitLayout(QToolBarAreaLayoutInfo *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  reference this_00;
  QToolBarAreaLayoutLine *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  QToolBarAreaLayoutLine *l;
  int i;
  bool reverse;
  int b;
  reference in_stack_ffffffffffffff48;
  reference in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QToolBarAreaLayoutLine *in_stack_ffffffffffffff90;
  int local_50;
  int local_2c;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&((DataPointer *)&in_RDI[1].rect)->d = 0;
  local_24 = 0;
  bVar5 = true;
  if (*(int *)((long)&(in_RDI->toolBarItems).d.size + 4) != 1) {
    bVar5 = *(int *)((long)&(in_RDI->toolBarItems).d.size + 4) == 3;
  }
  if (bVar5) {
    qVar4 = QList<QToolBarAreaLayoutLine>::size((QList<QToolBarAreaLayoutLine> *)in_RDI);
    local_50 = (int)qVar4 + -1;
  }
  else {
    local_50 = 0;
  }
  for (local_2c = local_50; (!bVar5 || (-1 < local_2c)); local_2c = iVar3 + local_2c) {
    if (!bVar5) {
      qVar4 = QList<QToolBarAreaLayoutLine>::size((QList<QToolBarAreaLayoutLine> *)in_RDI);
      if (local_2c == qVar4) break;
    }
    this_00 = QList<QToolBarAreaLayoutLine>::operator[]
                        ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff50,
                         (qsizetype)in_stack_ffffffffffffff48);
    bVar2 = QToolBarAreaLayoutLine::skip
                      ((QToolBarAreaLayoutLine *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar2) {
      if ((int)(in_RDI->toolBarItems).d.size == 1) {
        QRect::left((QRect *)0x6f0bff);
        QRect::setLeft(&in_stack_ffffffffffffff50->rect,
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        QRect::right((QRect *)0x6f0c26);
        QRect::setRight(&in_stack_ffffffffffffff50->rect,
                        (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        QRect::top((QRect *)0x6f0c58);
        QRect::setTop(&in_stack_ffffffffffffff50->rect,
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        QToolBarAreaLayoutLine::sizeHint(this_00);
        iVar3 = QSize::height((QSize *)0x6f0c8a);
        QRect::top((QRect *)0x6f0cc1);
        QRect::setBottom(&in_stack_ffffffffffffff50->rect,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        in_stack_ffffffffffffff90 = this_00;
      }
      else {
        in_stack_ffffffffffffff48 = this_00;
        QRect::top((QRect *)0x6f0cf0);
        QRect::setTop(&in_stack_ffffffffffffff50->rect,
                      (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        QRect::bottom((QRect *)0x6f0d16);
        QRect::setBottom(&this_00->rect,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        in_stack_ffffffffffffff5c = local_24;
        QRect::left((QRect *)0x6f0d48);
        QRect::setLeft(&this_00->rect,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        QToolBarAreaLayoutLine::sizeHint(in_stack_ffffffffffffff90);
        iVar3 = QSize::width((QSize *)0x6f0d7a);
        QRect::left((QRect *)0x6f0db1);
        QRect::setRight(&this_00->rect,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        in_stack_ffffffffffffff50 = this_00;
      }
      local_24 = iVar3 + local_24;
      QToolBarAreaLayoutLine::fitLayout(in_RDI);
    }
    iVar3 = 1;
    if (bVar5) {
      iVar3 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarAreaLayoutInfo::fitLayout()
{
    dirty = false;

    int b = 0;

    bool reverse = dockPos == QInternal::RightDock || dockPos == QInternal::BottomDock;

    int i = reverse ? lines.size() - 1 : 0;
    for (;;) {
        if ((reverse && i < 0) || (!reverse && i == lines.size()))
            break;

        QToolBarAreaLayoutLine &l = lines[i];
        if (!l.skip()) {
            if (o == Qt::Horizontal) {
                l.rect.setLeft(rect.left());
                l.rect.setRight(rect.right());
                l.rect.setTop(b + rect.top());
                b += l.sizeHint().height();
                l.rect.setBottom(b - 1 + rect.top());
            } else {
                l.rect.setTop(rect.top());
                l.rect.setBottom(rect.bottom());
                l.rect.setLeft(b + rect.left());
                b += l.sizeHint().width();
                l.rect.setRight(b - 1 + rect.left());
            }

            l.fitLayout();
        }

        i += reverse ? -1 : 1;
    }
}